

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

void __thiscall
Hospital::Doctors_Timetable_Setter(Hospital *this,int day,int time,string *last_name)

{
  reference this_00;
  reference this_01;
  ostream *this_02;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  string *local_20;
  string *last_name_local;
  int time_local;
  int day_local;
  Hospital *this_local;
  
  local_20 = last_name;
  last_name_local._0_4_ = time;
  last_name_local._4_4_ = day;
  _time_local = this;
  std::operator+((char *)local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x132836);
  std::operator+(local_40,(char *)local_60);
  this_00 = std::
            vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator[](&Doctors_Timetable_abi_cxx11_,(long)last_name_local._4_4_);
  this_01 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](this_00,(long)(int)last_name_local);
  std::__cxx11::string::operator=((string *)this_01,(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  std::__cxx11::string::~string(local_60);
  this_02 = std::operator<<((ostream *)&std::cout,"Doctor s on-call shift added !!");
  std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Hospital :: Doctors_Timetable_Setter(int day , int time ,string last_name) {

    Doctors_Timetable[day][time] = "    " + last_name + "    ";
    cout << "Doctor s on-call shift added !!"<<endl;
}